

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

void qrdecomp(double *A,int M,int N,double *bvec)

{
  size_t __size;
  double *x;
  double *v;
  long lVar1;
  double *A_00;
  double *C;
  double *pdVar2;
  ulong uVar3;
  long lVar4;
  int N_00;
  ulong uVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  double *pdVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  long local_a8;
  double local_a0;
  ulong local_68;
  double *local_60;
  double *local_58;
  
  if (M < N) {
    printf("M should be greater than or equal to N");
    exit(1);
  }
  lVar12 = (long)M;
  __size = lVar12 * 8;
  x = (double *)malloc(__size);
  v = (double *)malloc(__size);
  lVar1 = (long)N;
  A_00 = (double *)malloc(__size * lVar1);
  C = (double *)malloc(__size * lVar12);
  if (0 < N) {
    uVar13 = (ulong)(uint)N;
    uVar8 = (ulong)(uint)M;
    lVar11 = lVar1 << 0x20;
    pdVar10 = A + lVar1;
    uVar9 = 0;
    uVar14 = uVar13;
    local_a8 = lVar1;
    local_68 = uVar8;
    local_60 = A;
    local_58 = A;
    do {
      iVar7 = (int)uVar9;
      if ((long)uVar9 < lVar12) {
        uVar3 = 0;
        pdVar2 = local_60;
        do {
          x[uVar3] = *pdVar2;
          uVar3 = uVar3 + 1;
          pdVar2 = pdVar2 + lVar1;
        } while (local_68 != uVar3);
        N_00 = M - iVar7;
        local_a0 = house(x,N_00,v);
        bvec[uVar9] = local_a0;
        if ((long)uVar9 < lVar12) {
          lVar4 = 0;
          pdVar2 = local_58;
          uVar3 = uVar9;
          do {
            uVar5 = 0;
            lVar6 = lVar4;
            do {
              *(double *)((long)A_00 + (lVar6 >> 0x1d)) = pdVar2[uVar5];
              lVar6 = lVar6 + (local_68 << 0x20);
              uVar5 = uVar5 + 1;
            } while (uVar14 != uVar5);
            uVar3 = uVar3 + 1;
            lVar4 = lVar4 + 0x100000000;
            pdVar2 = pdVar2 + uVar13;
          } while (uVar3 != uVar8);
        }
      }
      else {
        N_00 = M - iVar7;
        local_a0 = house(x,N_00,v);
        bvec[uVar9] = local_a0;
      }
      mmult(A_00,v,C,N - iVar7,N_00,1);
      if ((long)uVar9 < lVar1) {
        lVar4 = 0;
        do {
          C[lVar4] = C[lVar4] * local_a0;
          lVar4 = lVar4 + 1;
        } while (local_a8 != lVar4);
      }
      mmult(v,C,A_00,N_00,1,N - iVar7);
      if ((long)uVar9 < lVar12) {
        lVar4 = 0;
        pdVar2 = local_60;
        uVar3 = uVar9;
        do {
          uVar5 = 0;
          lVar6 = lVar4;
          do {
            pdVar2[uVar5] = pdVar2[uVar5] - *(double *)((long)A_00 + (lVar6 >> 0x1d));
            uVar5 = uVar5 + 1;
            lVar6 = lVar6 + 0x100000000;
          } while (uVar14 != uVar5);
          uVar3 = uVar3 + 1;
          pdVar2 = pdVar2 + lVar1;
          lVar4 = lVar4 + lVar11;
        } while (uVar3 != uVar8);
      }
      uVar9 = uVar9 + 1;
      if ((long)uVar9 < lVar12) {
        uVar3 = 1;
        pdVar2 = pdVar10;
        do {
          *pdVar2 = v[uVar3];
          uVar3 = uVar3 + 1;
          pdVar2 = pdVar2 + lVar1;
        } while (local_68 != uVar3);
      }
      local_68 = local_68 - 1;
      local_60 = local_60 + lVar1 + 1;
      local_58 = local_58 + uVar13 + 1;
      uVar14 = uVar14 - 1;
      local_a8 = local_a8 + -1;
      lVar11 = lVar11 + -0x100000000;
      pdVar10 = pdVar10 + lVar1 + 1;
    } while (uVar9 != uVar13);
  }
  free(x);
  free(v);
  free(A_00);
  free(C);
  return;
}

Assistant:

void qrdecomp(double *A, int M, int N,double *bvec) {
	int j,i,k,u,t;
	double *x,*v,*AT,*w;
	double beta;
	
	if (M < N) {
			printf("M should be greater than or equal to N");
			exit(1);
	}
	x = (double*) malloc(sizeof(double) * M);
	v = (double*) malloc(sizeof(double) * M);
	AT = (double*) malloc(sizeof(double) * M * N);
	w = (double*) malloc(sizeof(double) * M * M);
	
	for(j = 0; j < N;++j) {
		for(i=j;i < M;++i) {
			x[i-j] = A[i*N+j];
			
		}
		
		beta = house(x,M-j,v);
		bvec[j] = beta;
	
		for (i=j; i < M; i++) {
			t = i * N;
			u = 0;
			for (k=j; k < N; k++) {
				AT[u+i-j] = A[k+t];
				u+=(M-j);
				
			}
			
		}
		
		
		mmult(AT,v,w,N-j,M-j,1);
		scale(w,N-j,1,beta);
		mmult(v,w,AT,M-j,1,N-j);
		for (i=j; i < M; i++) {
			t = i *N;
			for (k=j; k < N; k++) {
				A[t+k] -= AT[(i-j)*(N-j) + k - j];
			}
		}
		if (j < M) {
			for(i=j+1;i < M;++i) {
				A[i*N+j] = v[i-j];
			}
		}
		 
	}
	
	free(x);
	free(v);
	free(AT);
	free(w);
	
}